

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpccheck.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  ostream *poVar7;
  byte bVar8;
  int iVar9;
  string *input_stream;
  int read_size;
  char *__s;
  long lVar10;
  double dVar11;
  bool is_stable;
  int num_order;
  double margin;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  Buffer buffer;
  ostringstream error_message_5;
  ifstream ifs;
  LinearPredictiveCoefficientsStabilityCheck linear_predictive_coefficients_stability_check;
  bool local_4bd;
  int local_4bc;
  string local_4b8;
  int local_494;
  double local_490;
  double local_488;
  ulong local_480;
  vector<double,_std::allocator<double>_> local_478;
  undefined1 local_460 [32];
  pointer local_440;
  undefined **local_438;
  pointer local_430;
  pointer pdStack_428;
  pointer local_420;
  pointer pdStack_418;
  pointer local_410;
  pointer pdStack_408;
  string local_400 [3];
  ios_base local_390 [264];
  string local_288;
  byte abStack_268 [80];
  ios_base local_218 [408];
  LinearPredictiveCoefficientsStabilityCheck local_80;
  
  local_4bc = 0x19;
  local_488 = 1e-16;
  paVar1 = &local_400[0].field_2;
  local_480 = 0;
  local_494 = 1;
  iVar9 = 0;
  do {
    iVar5 = ya_getopt_long(argc,argv,"m:e:r:xh",(option *)0x0,(int *)0x0);
    if (iVar5 < 0x6d) {
      if (iVar5 == -1) {
        iVar5 = 2;
      }
      else if (iVar5 == 0x65) {
        std::__cxx11::string::string((string *)&local_288,ya_optarg,(allocator *)local_400);
        bVar2 = sptk::ConvertStringToInteger(&local_288,(int *)local_460);
        if (bVar2) {
          bVar2 = sptk::IsInRange(local_460._0_4_,0,2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          if (!bVar2) goto LAB_00103a3b;
          iVar5 = 4;
          bVar2 = true;
          local_494 = local_460._0_4_;
        }
        else {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
LAB_00103a3b:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_288,"The argument for the -e option must be an integer ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_288,"in the range of ",0x10);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_288,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
          std::ostream::operator<<((ostream *)poVar7,2);
          local_400[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"lpccheck","");
          sptk::PrintErrorMessage(local_400,(ostringstream *)&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400[0]._M_dataplus._M_p != paVar1) {
            operator_delete(local_400[0]._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
          std::ios_base::~ios_base(local_218);
          iVar5 = 1;
          bVar2 = false;
          iVar9 = 1;
        }
        if (bVar2) goto LAB_00103b0c;
      }
      else {
        if (iVar5 != 0x68) {
LAB_0010389e:
          anon_unknown.dwarf_2c2b::PrintUsage((ostream *)&std::cerr);
          goto LAB_00103ba8;
        }
        anon_unknown.dwarf_2c2b::PrintUsage((ostream *)&std::cout);
        iVar9 = 0;
        iVar5 = 1;
      }
    }
    else {
      if (iVar5 != 0x78) {
        if (iVar5 == 0x72) {
          std::__cxx11::string::string((string *)&local_288,ya_optarg,(allocator *)local_400);
          bVar2 = sptk::ConvertStringToDouble(&local_288,&local_488);
          if (!bVar2 || local_488 <= 0.0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p);
            }
          }
          else {
            dVar11 = local_488;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              local_490 = local_488;
              operator_delete(local_288._M_dataplus._M_p);
              dVar11 = local_490;
            }
            if (dVar11 < 1.0) goto LAB_00103b0c;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_288,"The argument for the -r option must be in (0.0, 1.0)",
                     0x34);
          local_400[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"lpccheck","");
          sptk::PrintErrorMessage(local_400,(ostringstream *)&local_288);
        }
        else {
          if (iVar5 != 0x6d) goto LAB_0010389e;
          std::__cxx11::string::string((string *)&local_288,ya_optarg,(allocator *)local_400);
          bVar2 = sptk::ConvertStringToInteger(&local_288,&local_4bc);
          bVar8 = -1 < local_4bc;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            local_490 = (double)CONCAT71(local_490._1_7_,-1 < local_4bc);
            operator_delete(local_288._M_dataplus._M_p);
            bVar8 = local_490._0_1_;
          }
          if ((bVar2 & bVar8) != 0) goto LAB_00103b0c;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_288,"The argument for the -m option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_288,"non-negative integer",0x14);
          local_400[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"lpccheck","");
          sptk::PrintErrorMessage(local_400,(ostringstream *)&local_288);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_400[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
        std::ios_base::~ios_base(local_218);
LAB_00103ba8:
        iVar5 = 1;
        iVar9 = 1;
        goto LAB_00103bb2;
      }
      local_480 = CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
LAB_00103b0c:
      iVar5 = 0;
    }
LAB_00103bb2:
  } while (iVar5 == 0);
  if (iVar5 == 2) {
    if (argc - ya_optind < 2) {
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      if (bVar2) {
        input_stream = &local_288;
        std::ifstream::ifstream(input_stream);
        if ((__s == (char *)0x0) ||
           (std::ifstream::open((char *)&local_288,(_Ios_Openmode)__s),
           (abStack_268[*(long *)(local_288._M_dataplus._M_p + -0x18)] & 5) == 0)) {
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            input_stream = (string *)&std::cin;
          }
          sptk::LinearPredictiveCoefficientsStabilityCheck::
          LinearPredictiveCoefficientsStabilityCheck(&local_80,local_4bc,local_488);
          local_460._0_8_ = &PTR__Buffer_00110bd8;
          local_460._8_8_ = &PTR__Buffer_00110c08;
          local_460._16_8_ = 0;
          local_460._24_8_ = 0;
          local_440 = (pointer)0x0;
          local_438 = &PTR__Buffer_00110c38;
          local_430 = (pointer)0x0;
          pdStack_428 = (pointer)0x0;
          local_420 = (pointer)0x0;
          pdStack_418 = (pointer)0x0;
          local_410 = (pointer)0x0;
          pdStack_408 = (pointer)0x0;
          if (local_80.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_400,
                       "Failed to initialize LinearPredictiveCoefficientsStabilityCheck",0x3f);
            local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"lpccheck","");
            sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_400);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
              operator_delete(local_4b8._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
            std::ios_base::~ios_base(local_390);
            iVar9 = 1;
          }
          else {
            lVar10 = (long)local_4bc;
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_478,lVar10 + 1U,(allocator_type *)local_400);
            iVar5 = 0;
            do {
              read_size = (int)(lVar10 + 1U);
              bVar2 = sptk::ReadStream<double>
                                (false,0,0,read_size,&local_478,(istream *)input_stream,(int *)0x0);
              if (!bVar2) {
                iVar9 = 0;
                break;
              }
              local_4bd = false;
              if ((local_480 & 1) == 0) {
LAB_00103f0f:
                if ((local_4bd == false) && (local_494 != 0)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
                  poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_400,iVar5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"th frame is unstable",0x14);
                  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_4b8,"lpccheck","");
                  sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_400);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                    operator_delete(local_4b8._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
                  std::ios_base::~ios_base(local_390);
                  if (local_494 != 2) goto LAB_00103fbf;
                  goto LAB_00104102;
                }
LAB_00103fbf:
                bVar4 = sptk::WriteStream<double>
                                  (0,read_size,&local_478,(ostream *)&std::cout,(int *)0x0);
                bVar2 = true;
                if (!bVar4) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_400,"Failed to write linear predictive coefficients",
                             0x2e);
                  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_4b8,"lpccheck","");
                  sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_400);
                  goto LAB_001040cd;
                }
              }
              else {
                bVar2 = sptk::LinearPredictiveCoefficientsStabilityCheck::Run
                                  (&local_80,&local_478,&local_4bd,(Buffer *)local_460);
                if (bVar2) {
                  bVar2 = sptk::LinearPredictiveCoefficientsStabilityCheck::Run
                                    (&local_80,&local_478,
                                     (vector<double,_std::allocator<double>_> *)0x0,&local_4bd,
                                     (Buffer *)local_460);
                  if (bVar2) goto LAB_00103f0f;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_400,
                             "Failed to check stability of linear predictive coefficients",0x3b);
                  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_4b8,"lpccheck","");
                  sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_400);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_400,
                             "Failed to check stability of linear predictive coefficients",0x3b);
                  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_4b8,"lpccheck","");
                  sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_400);
                }
LAB_001040cd:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                  operator_delete(local_4b8._M_dataplus._M_p);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
                std::ios_base::~ios_base(local_390);
LAB_00104102:
                iVar9 = 1;
                bVar2 = false;
              }
              iVar5 = iVar5 + 1;
            } while (bVar2);
            if (local_478.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_478.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer::~Buffer((Buffer *)local_460);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_400,"Cannot open file ",0x11);
          sVar6 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_400,__s,sVar6);
          local_460._0_8_ = local_460 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"lpccheck","");
          sptk::PrintErrorMessage((string *)local_460,(ostringstream *)local_400);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
          std::ios_base::~ios_base(local_390);
          iVar9 = 1;
        }
        std::ifstream::~ifstream(&local_288);
        return iVar9;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_288,"Cannot set translation mode",0x1b);
      local_400[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"lpccheck","");
      sptk::PrintErrorMessage(local_400,(ostringstream *)&local_288);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_288,"Too many input files",0x14);
      local_400[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"lpccheck","");
      sptk::PrintErrorMessage(local_400,(ostringstream *)&local_288);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_400[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
    std::ios_base::~ios_base(local_218);
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  WarningType warning_type(kDefaultWarningType);
  double margin(kDefaultMargin);
  bool modification_flag(kDefaultModificationFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:e:r:xh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        const int min(0);
        const int max(static_cast<int>(kNumWarningTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        warning_type = static_cast<WarningType>(tmp);
        break;
      }
      case 'r': {
        if (!sptk::ConvertStringToDouble(optarg, &margin) || margin <= 0.0 ||
            1.0 <= margin) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -r option must be in (0.0, 1.0)";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        break;
      }
      case 'x': {
        modification_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_rest_args(argc - optind);
  if (1 < num_rest_args) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }
  const char* input_file(0 == num_rest_args ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lpccheck", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LinearPredictiveCoefficientsStabilityCheck
      linear_predictive_coefficients_stability_check(num_order, margin);
  sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer buffer;
  if (!linear_predictive_coefficients_stability_check.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize LinearPredictiveCoefficientsStabilityCheck";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> linear_predictive_coefficients(length);

  for (int frame_index(0);
       sptk::ReadStream(false, 0, 0, length, &linear_predictive_coefficients,
                        &input_stream, NULL);
       ++frame_index) {
    bool is_stable(false);
    if (modification_flag) {
      if (!linear_predictive_coefficients_stability_check.Run(
              &linear_predictive_coefficients, &is_stable, &buffer)) {
        std::ostringstream error_message;
        error_message
            << "Failed to check stability of linear predictive coefficients";
        sptk::PrintErrorMessage("lpccheck", error_message);
        return 1;
      } else {
        if (!linear_predictive_coefficients_stability_check.Run(
                linear_predictive_coefficients, NULL, &is_stable, &buffer)) {
          std::ostringstream error_message;
          error_message
              << "Failed to check stability of linear predictive coefficients";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
      }
    }

    if (!is_stable && kIgnore != warning_type) {
      std::ostringstream error_message;
      error_message << frame_index << "th frame is unstable";
      sptk::PrintErrorMessage("lpccheck", error_message);
      if (kExit == warning_type) return 1;
    }

    if (!sptk::WriteStream(0, length, linear_predictive_coefficients,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write linear predictive coefficients";
      sptk::PrintErrorMessage("lpccheck", error_message);
      return 1;
    }
  }

  return 0;
}